

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fColorClearTest.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::ColorClearCase::iterate(ColorClearCase *this)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint width;
  uint height;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  RGBA a_00;
  TestLog *pTVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  RenderTarget *this_00;
  PixelFormat *this_01;
  size_type sVar14;
  int *piVar15;
  byte *pbVar16;
  TestLog *this_02;
  MessageBuilder *pMVar17;
  byte local_971;
  RGBA *local_970;
  uint local_890;
  allocator<char> local_841;
  string local_840;
  allocator<char> local_819;
  string local_818;
  LogImage local_7f8;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  LogImageSet local_718;
  byte local_6d1;
  undefined4 local_6d0;
  bool isFinal;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  LogImage local_680;
  allocator<char> local_5e9;
  string local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  LogImage local_5a0;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  LogImage local_4c0;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  LogImageSet local_3e0;
  MessageBuilder local_3a0;
  deUint32 local_220;
  int local_21c;
  deUint32 local_218;
  deUint32 local_214;
  deUint32 local_210;
  byte local_209;
  deUint32 local_208;
  RGBA RStack_204;
  bool isPixelOk;
  RGBA local_200;
  byte local_1f9;
  RGBA diff;
  deUint8 colMask;
  RGBA resRGBA;
  RGBA refRGBA;
  int offset;
  int x_1;
  int y_1;
  bool isImageOk;
  RGBA maxDiff;
  RGBA diffColor;
  RGBA matchColor;
  RGBA colorThreshold;
  int local_1a4;
  int ndx;
  deUint8 clearMask_1;
  reference pvStack_198;
  RGBA clearCol_1;
  ClearInfo *op_1;
  int local_188;
  int opNdx_1;
  int spanLength;
  int iStack_17c;
  deUint8 spanKnownMask;
  RGBA spanColor;
  int x;
  ClearInfo *op;
  undefined1 local_168 [4];
  int opNdx;
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  scanlineClearOps;
  int y;
  ClearInfo local_134;
  byte local_119;
  RGBA local_118;
  uint uStack_114;
  deUint8 clearMask;
  RGBA clearCol;
  int a;
  int b;
  int g;
  int r;
  int clearHeight;
  int clearWidth;
  int clearY;
  int clearX;
  int clearNdx;
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  clearOps;
  undefined1 local_d0 [4];
  int numClears;
  Surface diffImage;
  Surface resImage;
  Surface refImage;
  allocator<unsigned_char> local_72;
  value_type_conflict4 local_71;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixelKnownChannelMask;
  Random rnd;
  int numPixels;
  int targetHeight;
  int targetWidth;
  PixelFormat *pixelFormat;
  RenderTarget *renderTarget;
  Functions *gl;
  TestLog *log;
  ColorClearCase *this_local;
  long lVar13;
  
  pTVar11 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar12 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar12->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar4);
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  this_01 = tcu::RenderTarget::getPixelFormat(this_00);
  width = tcu::RenderTarget::getWidth(this_00);
  height = tcu::RenderTarget::getHeight(this_00);
  dVar5 = ::deInt32Hash(this->m_curIter);
  de::Random::Random((Random *)
                     ((long)&pixelKnownChannelMask.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar5);
  local_71 = '\0';
  std::allocator<unsigned_char>::allocator(&local_72);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
             (long)(int)(width * height),&local_71,&local_72);
  std::allocator<unsigned_char>::~allocator(&local_72);
  tcu::Surface::Surface((Surface *)&resImage.m_pixels.m_cap,width,height);
  tcu::Surface::Surface((Surface *)&diffImage.m_pixels.m_cap,width,height);
  tcu::Surface::Surface((Surface *)local_d0,width,height);
  dVar5 = de::Random::getUint32
                    ((Random *)
                     ((long)&pixelKnownChannelMask.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  clearOps.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       dVar5 % (uint)((this->m_numClearsMax + 1) - this->m_numClearsMin) + this->m_numClearsMin;
  std::
  vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>::
  vector((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
          *)&clearX);
  if ((this->m_testScissoring & 1U) != 0) {
    (**(code **)(lVar13 + 0x5e0))(0xc11);
  }
  for (clearY = 0;
      clearY < clearOps.
               super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; clearY = clearY + 1) {
    if (((this->m_testScissoring & 1U) == 0) ||
       ((clearY == 0 && ((this->m_firstClearFull & 1U) != 0)))) {
      clearWidth = 0;
      clearHeight = 0;
      g = height;
      r = width;
    }
    else {
      dVar5 = de::Random::getUint32
                        ((Random *)
                         ((long)&pixelKnownChannelMask.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      clearWidth = dVar5 % (width * 2) - width;
      dVar5 = de::Random::getUint32
                        ((Random *)
                         ((long)&pixelKnownChannelMask.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      clearHeight = dVar5 % (height * 2) - height;
      dVar5 = de::Random::getUint32
                        ((Random *)
                         ((long)&pixelKnownChannelMask.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      r = dVar5 % width;
      dVar5 = de::Random::getUint32
                        ((Random *)
                         ((long)&pixelKnownChannelMask.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      g = dVar5 % height;
    }
    (**(code **)(lVar13 + 0x1290))(clearWidth,clearHeight,r,g);
    dVar5 = de::Random::getUint32
                      ((Random *)
                       ((long)&pixelKnownChannelMask.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    dVar6 = de::Random::getUint32
                      ((Random *)
                       ((long)&pixelKnownChannelMask.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    dVar7 = de::Random::getUint32
                      ((Random *)
                       ((long)&pixelKnownChannelMask.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    clearCol.m_value = dVar7 & 0xff;
    if ((this->m_testAlpha & 1U) == 0) {
      local_890 = 0xff;
    }
    else {
      dVar7 = de::Random::getUint32
                        ((Random *)
                         ((long)&pixelKnownChannelMask.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_890 = dVar7 & 0xff;
    }
    uStack_114 = local_890;
    tcu::RGBA::RGBA(&local_118,dVar5 & 0xff,dVar6 & 0xff,clearCol.m_value,local_890);
    (**(code **)(lVar13 + 0x1c0))
              ((float)(dVar5 & 0xff) / 255.0,(float)(dVar6 & 0xff) / 255.0,
               (float)(int)clearCol.m_value / 255.0,(float)(int)uStack_114 / 255.0);
    if (((this->m_testColorMasks & 1U) == 0) ||
       ((clearY == 0 && ((this->m_firstClearFull & 1U) != 0)))) {
      local_119 = 0xf;
    }
    else {
      dVar5 = de::Random::getUint32
                        ((Random *)
                         ((long)&pixelKnownChannelMask.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_119 = (byte)dVar5 & 0xf;
    }
    (**(code **)(lVar13 + 0x238))
              (local_119 & 1,(local_119 & 2) >> 1,(local_119 & 4) >> 2,local_119 >> 3);
    (**(code **)(lVar13 + 0x188))(0x4000);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&y,clearWidth,clearHeight,r,g);
    ClearInfo::ClearInfo(&local_134,(IVec4 *)&y,local_119,local_118);
    std::
    vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ::push_back((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                 *)&clearX,&local_134);
    tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  }
  scanlineClearOps.
  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  do {
    if ((int)height <=
        scanlineClearOps.
        super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      pRVar12 = Context::getRenderContext((this->super_TestCase).m_context);
      tcu::Surface::getAccess((PixelBufferAccess *)&matchColor,(Surface *)&diffImage.m_pixels.m_cap)
      ;
      glu::readPixels(pRVar12,0,0,(PixelBufferAccess *)&matchColor);
      dVar5 = (**(code **)(lVar13 + 0x800))();
      glu::checkError(dVar5,"glReadPixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fColorClearTest.cpp"
                      ,0xe9);
      diffColor = tcu::PixelFormat::getColorThreshold(this_01);
      tcu::RGBA::RGBA(&maxDiff,0,0xff,0,0xff);
      tcu::RGBA::RGBA((RGBA *)&stack0xfffffffffffffe24,0xff,0,0,0xff);
      tcu::RGBA::RGBA((RGBA *)&y_1,0,0,0,0);
      x_1._3_1_ = 1;
      cVar3 = (**(code **)(lVar13 + 0xc70))(0xbd0);
      if (cVar3 != '\0') {
        iVar4 = tcu::RGBA::getRed(&diffColor);
        tcu::RGBA::setRed(&diffColor,iVar4 + 1);
        iVar4 = tcu::RGBA::getGreen(&diffColor);
        tcu::RGBA::setGreen(&diffColor,iVar4 + 1);
        iVar4 = tcu::RGBA::getBlue(&diffColor);
        tcu::RGBA::setBlue(&diffColor,iVar4 + 1);
        iVar4 = tcu::RGBA::getAlpha(&diffColor);
        tcu::RGBA::setAlpha(&diffColor,iVar4 + 1);
      }
      for (offset = 0; offset < (int)height; offset = offset + 1) {
        for (refRGBA.m_value = 0; (int)refRGBA.m_value < (int)width;
            refRGBA.m_value = refRGBA.m_value + 1) {
          a_00 = tcu::Surface::getPixel((Surface *)&resImage.m_pixels.m_cap,refRGBA.m_value,offset);
          diff = tcu::Surface::getPixel((Surface *)&diffImage.m_pixels.m_cap,refRGBA.m_value,offset)
          ;
          pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                               (long)(int)(offset * width + refRGBA.m_value));
          local_1f9 = *pbVar16;
          local_208 = diff.m_value;
          RStack_204 = a_00;
          local_200 = tcu::computeAbsDiffMasked(a_00,diff,(uint)local_1f9);
          local_210 = diffColor.m_value;
          local_209 = tcu::RGBA::isBelowThreshold(&local_200,diffColor);
          if ((bool)local_209) {
            local_970 = &maxDiff;
          }
          else {
            local_970 = (RGBA *)&stack0xfffffffffffffe24;
          }
          local_214 = local_970->m_value;
          tcu::Surface::setPixel((Surface *)local_d0,refRGBA.m_value,offset,(RGBA)local_214);
          local_971 = 0;
          if (x_1._3_1_ != 0) {
            local_971 = local_209;
          }
          x_1._3_1_ = local_971 & 1;
          local_21c = y_1;
          local_220 = local_200.m_value;
          local_218 = (deUint32)tcu::max((RGBA)y_1,local_200);
          y_1 = local_218;
        }
      }
      if (x_1._3_1_ == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
        this_02 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3a0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar17 = tcu::MessageBuilder::operator<<
                            (&local_3a0,(char (*) [37])"Image comparison failed, max diff = ");
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(RGBA *)&y_1);
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [15])0x1307ef1);
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&diffColor);
        tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"Result",&local_401)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"Resulting framebuffer",&local_429);
        tcu::LogImageSet::LogImageSet(&local_3e0,&local_400,&local_428);
        pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_3e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"Result",&local_4e1)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_508,"Resulting framebuffer",&local_509);
        tcu::LogImage::LogImage
                  (&local_4c0,&local_4e0,&local_508,(Surface *)&diffImage.m_pixels.m_cap,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_4c0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5c0,"Reference",&local_5c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5e8,"Reference image",&local_5e9);
        tcu::LogImage::LogImage
                  (&local_5a0,&local_5c0,&local_5e8,(Surface *)&resImage.m_pixels.m_cap,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_5a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6a0,"DiffMask",&local_6a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c8,"Failing pixels",(allocator<char> *)&isFinal);
        tcu::LogImage::LogImage
                  (&local_680,&local_6a0,&local_6c8,(Surface *)local_d0,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_680);
        tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_680);
        std::__cxx11::string::~string((string *)&local_6c8);
        std::allocator<char>::~allocator((allocator<char> *)&isFinal);
        std::__cxx11::string::~string((string *)&local_6a0);
        std::allocator<char>::~allocator(&local_6a1);
        tcu::LogImage::~LogImage(&local_5a0);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::allocator<char>::~allocator(&local_5e9);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::allocator<char>::~allocator(&local_5c1);
        tcu::LogImage::~LogImage(&local_4c0);
        std::__cxx11::string::~string((string *)&local_508);
        std::allocator<char>::~allocator(&local_509);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::allocator<char>::~allocator(&local_4e1);
        tcu::LogImageSet::~LogImageSet(&local_3e0);
        std::__cxx11::string::~string((string *)&local_428);
        std::allocator<char>::~allocator(&local_429);
        std::__cxx11::string::~string((string *)&local_400);
        std::allocator<char>::~allocator(&local_401);
        this_local._4_4_ = STOP;
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        iVar4 = this->m_curIter + 1;
        this->m_curIter = iVar4;
        local_6d1 = iVar4 == this->m_numIters;
        if ((bool)local_6d1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_738,"Result",&local_739);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_760,"Resulting framebuffer",&local_761);
          tcu::LogImageSet::LogImageSet(&local_718,&local_738,&local_760);
          pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_718);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_818,"Result",&local_819);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_840,"Resulting framebuffer",&local_841);
          tcu::LogImage::LogImage
                    (&local_7f8,&local_818,&local_840,(Surface *)&diffImage.m_pixels.m_cap,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_7f8);
          tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
          tcu::LogImage::~LogImage(&local_7f8);
          std::__cxx11::string::~string((string *)&local_840);
          std::allocator<char>::~allocator(&local_841);
          std::__cxx11::string::~string((string *)&local_818);
          std::allocator<char>::~allocator(&local_819);
          tcu::LogImageSet::~LogImageSet(&local_718);
          std::__cxx11::string::~string((string *)&local_760);
          std::allocator<char>::~allocator(&local_761);
          std::__cxx11::string::~string((string *)&local_738);
          std::allocator<char>::~allocator(&local_739);
        }
        this_local._4_4_ = (IterateResult)((local_6d1 & 1) == 0);
      }
      local_6d0 = 1;
      std::
      vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
      ::~vector((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                 *)&clearX);
      tcu::Surface::~Surface((Surface *)local_d0);
      tcu::Surface::~Surface((Surface *)&diffImage.m_pixels.m_cap);
      tcu::Surface::~Surface((Surface *)&resImage.m_pixels.m_cap);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      de::Random::~Random((Random *)
                          ((long)&pixelKnownChannelMask.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      return this_local._4_4_;
    }
    std::
    vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ::vector((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
              *)local_168);
    for (op._4_4_ = 0;
        sVar14 = std::
                 vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                 ::size((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                         *)&clearX), op._4_4_ < (int)sVar14; op._4_4_ = op._4_4_ + 1) {
      _spanColor = std::
                   vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                   ::operator[]((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                 *)&clearX,(long)op._4_4_);
      iVar9 = scanlineClearOps.
              super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      piVar15 = tcu::Vector<int,_4>::y(&_spanColor->m_rect);
      iVar4 = *piVar15;
      piVar15 = tcu::Vector<int,_4>::y(&_spanColor->m_rect);
      iVar8 = *piVar15;
      piVar15 = tcu::Vector<int,_4>::w(&_spanColor->m_rect);
      bVar2 = de::inBounds<int>(iVar9,iVar4,iVar8 + *piVar15);
      if (bVar2) {
        std::
        vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
        ::push_back((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                     *)local_168,_spanColor);
      }
    }
    for (iStack_17c = 0; iStack_17c < (int)width; iStack_17c = local_188 + iStack_17c) {
      tcu::RGBA::RGBA((RGBA *)&spanLength);
      opNdx_1._3_1_ = 0;
      local_188 = width - iStack_17c;
      sVar14 = std::
               vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
               ::size((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                       *)local_168);
      op_1._4_4_ = (int)sVar14;
      do {
        while( true ) {
          op_1._4_4_ = op_1._4_4_ + -1;
          if (op_1._4_4_ < 0) goto LAB_00b32759;
          pvStack_198 = std::
                        vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                        ::operator[]((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                      *)local_168,(long)op_1._4_4_);
          iVar4 = iStack_17c;
          iVar8 = tcu::Vector<int,_4>::x(&pvStack_198->m_rect);
          iVar9 = tcu::Vector<int,_4>::x(&pvStack_198->m_rect);
          iVar10 = tcu::Vector<int,_4>::z(&pvStack_198->m_rect);
          bVar2 = de::inBounds<int>(iVar4,iVar8,iVar9 + iVar10);
          iVar4 = scanlineClearOps.
                  super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          if (bVar2) break;
LAB_00b326d2:
          iVar4 = tcu::Vector<int,_4>::x(&pvStack_198->m_rect);
          if (iStack_17c < iVar4) {
            iVar4 = tcu::Vector<int,_4>::x(&pvStack_198->m_rect);
            local_188 = ::deMin32(local_188,iVar4 - iStack_17c);
          }
        }
        iVar8 = tcu::Vector<int,_4>::y(&pvStack_198->m_rect);
        iVar9 = tcu::Vector<int,_4>::y(&pvStack_198->m_rect);
        iVar10 = tcu::Vector<int,_4>::w(&pvStack_198->m_rect);
        bVar2 = de::inBounds<int>(iVar4,iVar8,iVar9 + iVar10);
        if (!bVar2) goto LAB_00b326d2;
        iVar4 = tcu::Vector<int,_4>::x(&pvStack_198->m_rect);
        iVar8 = tcu::Vector<int,_4>::z(&pvStack_198->m_rect);
        local_188 = ::deMin32(local_188,(iVar4 + iVar8) - iStack_17c);
        ndx = (pvStack_198->m_color).m_value;
        bVar1 = pvStack_198->m_colorMask;
        if (((bVar1 & 1) != 0) && ((opNdx_1._3_1_ & 1) == 0)) {
          iVar4 = tcu::RGBA::getRed((RGBA *)&ndx);
          tcu::RGBA::setRed((RGBA *)&spanLength,iVar4);
        }
        if (((bVar1 & 2) != 0) && ((opNdx_1._3_1_ & 2) == 0)) {
          iVar4 = tcu::RGBA::getGreen((RGBA *)&ndx);
          tcu::RGBA::setGreen((RGBA *)&spanLength,iVar4);
        }
        if (((bVar1 & 4) != 0) && ((opNdx_1._3_1_ & 4) == 0)) {
          iVar4 = tcu::RGBA::getBlue((RGBA *)&ndx);
          tcu::RGBA::setBlue((RGBA *)&spanLength,iVar4);
        }
        if (((bVar1 & 8) != 0) && ((opNdx_1._3_1_ & 8) == 0)) {
          iVar4 = tcu::RGBA::getAlpha((RGBA *)&ndx);
          tcu::RGBA::setAlpha((RGBA *)&spanLength,iVar4);
        }
        opNdx_1._3_1_ = opNdx_1._3_1_ | bVar1;
      } while (opNdx_1._3_1_ != 0xf);
LAB_00b32759:
      if (this_01->alphaBits == 0) {
        tcu::RGBA::setAlpha((RGBA *)&spanLength,0xff);
      }
      for (local_1a4 = 0; local_1a4 < local_188; local_1a4 = local_1a4 + 1) {
        tcu::Surface::setPixel
                  ((Surface *)&resImage.m_pixels.m_cap,iStack_17c + local_1a4,
                   scanlineClearOps.
                   super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(RGBA)spanLength);
        pbVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                             (long)(int)(scanlineClearOps.
                                         super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ *
                                         width + iStack_17c + local_1a4));
        *pbVar16 = *pbVar16 | opNdx_1._3_1_;
      }
    }
    std::
    vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ::~vector((vector<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
               *)local_168);
    scanlineClearOps.
    super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         scanlineClearOps.
         super__Vector_base<deqp::gles3::Functional::ClearInfo,_std::allocator<deqp::gles3::Functional::ClearInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

TestCase::IterateResult ColorClearCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const glw::Functions&		gl						= m_context.getRenderContext().getFunctions();
	const tcu::RenderTarget&	renderTarget			= m_context.getRenderTarget();
	const tcu::PixelFormat&		pixelFormat				= renderTarget.getPixelFormat();
	const int					targetWidth				= renderTarget.getWidth();
	const int					targetHeight			= renderTarget.getHeight();
	const int					numPixels				= targetWidth * targetHeight;

	de::Random					rnd						(deInt32Hash(m_curIter));
	vector<deUint8>				pixelKnownChannelMask	(numPixels, 0);
	Surface						refImage				(targetWidth, targetHeight);
	Surface						resImage				(targetWidth, targetHeight);
	Surface						diffImage				(targetWidth, targetHeight);
	int							numClears				= rnd.getUint32() % (m_numClearsMax + 1 - m_numClearsMin) + m_numClearsMin;
	std::vector<ClearInfo>		clearOps;

	if (m_testScissoring)
		gl.enable(GL_SCISSOR_TEST);

	for (int clearNdx = 0; clearNdx < numClears; clearNdx++)
	{
		// Rectangle.
		int clearX;
		int clearY;
		int clearWidth;
		int clearHeight;
		if (!m_testScissoring || (clearNdx == 0 && m_firstClearFull))
		{
			clearX		= 0;
			clearY		= 0;
			clearWidth	= targetWidth;
			clearHeight	= targetHeight;
		}
		else
		{
			clearX		= (rnd.getUint32() % (2*targetWidth)) - targetWidth;
			clearY		= (rnd.getUint32() % (2*targetHeight)) - targetHeight;
			clearWidth	= (rnd.getUint32() % targetWidth);
			clearHeight	= (rnd.getUint32() % targetHeight);
		}
		gl.scissor(clearX, clearY, clearWidth, clearHeight);

		// Color.
		int		r = (int)(rnd.getUint32() & 0xFF);
		int		g = (int)(rnd.getUint32() & 0xFF);
		int		b = (int)(rnd.getUint32() & 0xFF);
		int		a = m_testAlpha ? (int)(rnd.getUint32() & 0xFF) : 0xFF;
		RGBA	clearCol(r, g, b, a);
		gl.clearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, float(a)/255.0f);

		// Mask.
		deUint8	clearMask;
		if (!m_testColorMasks || (clearNdx == 0 && m_firstClearFull))
			clearMask = 0xF;
		else
			clearMask = (rnd.getUint32() & 0xF);
		gl.colorMask((clearMask&0x1) != 0, (clearMask&0x2) != 0, (clearMask&0x4) != 0, (clearMask&0x8) != 0);

		// Clear & store op.
		gl.clear(GL_COLOR_BUFFER_BIT);
		clearOps.push_back(ClearInfo(tcu::IVec4(clearX, clearY, clearWidth, clearHeight), clearMask, clearCol));

		// Let watchdog know we're alive.
		m_testCtx.touchWatchdog();
	}

	// Compute reference image.
	{
		for (int y = 0; y < targetHeight; y++)
		{
			std::vector<ClearInfo>	scanlineClearOps;

			// Find all rectangles affecting this scanline.
			for (int opNdx = 0; opNdx < (int)clearOps.size(); opNdx++)
			{
				ClearInfo& op = clearOps[opNdx];
				if (de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					scanlineClearOps.push_back(op);
			}

			// Compute reference for scanline.
			int x = 0;
			while (x < targetWidth)
			{
				tcu::RGBA	spanColor;
				deUint8		spanKnownMask	= 0;
				int			spanLength		= (targetWidth - x);

				for (int opNdx = (int)scanlineClearOps.size() - 1; opNdx >= 0; opNdx--)
				{
					const ClearInfo& op = scanlineClearOps[opNdx];

					if (de::inBounds(x, op.m_rect.x(), op.m_rect.x()+op.m_rect.z()) &&
						de::inBounds(y, op.m_rect.y(), op.m_rect.y()+op.m_rect.w()))
					{
						// Compute span length until end of given rectangle.
						spanLength = deMin32(spanLength, op.m_rect.x() + op.m_rect.z() - x);

						tcu::RGBA	clearCol	= op.m_color;
						deUint8		clearMask	= op.m_colorMask;
						if ((clearMask & 0x1) && !(spanKnownMask & 0x1)) spanColor.setRed(clearCol.getRed());
						if ((clearMask & 0x2) && !(spanKnownMask & 0x2)) spanColor.setGreen(clearCol.getGreen());
						if ((clearMask & 0x4) && !(spanKnownMask & 0x4)) spanColor.setBlue(clearCol.getBlue());
						if ((clearMask & 0x8) && !(spanKnownMask & 0x8)) spanColor.setAlpha(clearCol.getAlpha());
						spanKnownMask |= clearMask;

						// Break if have all colors.
						if (spanKnownMask == 0xF)
							break;
					}
					else if (op.m_rect.x() > x)
						spanLength = deMin32(spanLength, op.m_rect.x() - x);
				}

				// Set reference alpha channel to 0xFF, if no alpha in target.
				if (pixelFormat.alphaBits == 0)
					spanColor.setAlpha(0xFF);

				// Fill the span.
				for (int ndx = 0; ndx < spanLength; ndx++)
				{
					refImage.setPixel(x + ndx, y, spanColor);
					pixelKnownChannelMask[y*targetWidth + x + ndx] |= spanKnownMask;
				}

				x += spanLength;
			}
		}
	}

	glu::readPixels(m_context.getRenderContext(), 0, 0, resImage.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels");

	// Compute difference image.
	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	RGBA maxDiff(0, 0, 0, 0);
	bool isImageOk = true;

	if (gl.isEnabled(GL_DITHER))
	{
		colorThreshold.setRed(colorThreshold.getRed() + 1);
		colorThreshold.setGreen(colorThreshold.getGreen() + 1);
		colorThreshold.setBlue(colorThreshold.getBlue() + 1);
		colorThreshold.setAlpha(colorThreshold.getAlpha() + 1);
	}

	for (int y = 0; y < targetHeight; y++)
	for (int x = 0; x < targetWidth; x++)
	{
		int			offset		= (y*targetWidth + x);
		RGBA		refRGBA		= refImage.getPixel(x, y);
		RGBA		resRGBA		= resImage.getPixel(x, y);
		deUint8		colMask		= pixelKnownChannelMask[offset];
		RGBA		diff		= computeAbsDiffMasked(refRGBA, resRGBA, colMask);
		bool		isPixelOk	= diff.isBelowThreshold(colorThreshold);

		diffImage.setPixel(x, y, isPixelOk ? matchColor : diffColor);

		isImageOk	= isImageOk && isPixelOk;
		maxDiff		= max(maxDiff, diff);
	}

	if (isImageOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		m_testCtx.getLog() << tcu::TestLog::Message << "Image comparison failed, max diff = " << maxDiff << ", threshold = " << colorThreshold << tcu::TestLog::EndMessage;

		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::Image("Reference",	"Reference image",			refImage)
			<< TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
			<< TestLog::EndImageSet;
		return TestCase::STOP;
	}

	bool isFinal = (++m_curIter == m_numIters);

	// On final frame, dump images.
	if (isFinal)
	{
		log << TestLog::ImageSet("Result", "Resulting framebuffer")
			<< TestLog::Image("Result",		"Resulting framebuffer",	resImage)
			<< TestLog::EndImageSet;
	}

	return isFinal ? TestCase::STOP : TestCase::CONTINUE;
}